

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void fixupL(int n,int *perm_r,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int_t *piVar4;
  int_t *piVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int_t *piVar10;
  
  if (1 < n) {
    piVar3 = Glu->xsup;
    piVar4 = Glu->lsub;
    piVar5 = Glu->xlsub;
    iVar1 = Glu->supno[(uint)n];
    lVar7 = 0;
    iVar8 = 0;
    while (lVar7 <= iVar1) {
      lVar6 = (long)piVar3[lVar7];
      iVar2 = piVar5[lVar6];
      piVar5[lVar6] = iVar8;
      piVar10 = piVar4 + iVar8;
      for (lVar9 = (long)iVar2; lVar9 < piVar5[lVar6 + 1]; lVar9 = lVar9 + 1) {
        *piVar10 = perm_r[piVar4[lVar9]];
        iVar8 = iVar8 + 1;
        piVar10 = piVar10 + 1;
      }
      lVar7 = lVar7 + 1;
      while (lVar6 = lVar6 + 1, lVar6 < piVar3[lVar7]) {
        piVar5[lVar6] = iVar8;
      }
    }
    piVar5[(uint)n] = iVar8;
  }
  return;
}

Assistant:

void
fixupL(const int n, const int *perm_r, GlobalLU_t *Glu)
{
    int nsuper, fsupc, i, k;
    int_t nextl, j, jstrt;
    int   *xsup;
    int_t *lsub, *xlsub;

    if ( n <= 1 ) return;

    xsup   = Glu->xsup;
    lsub   = Glu->lsub;
    xlsub  = Glu->xlsub;
    nextl  = 0;
    nsuper = (Glu->supno)[n];
    
    /* 
     * For each supernode ...
     */
    for (i = 0; i <= nsuper; i++) {
	fsupc = xsup[i];
	jstrt = xlsub[fsupc];
	xlsub[fsupc] = nextl;
	for (j = jstrt; j < xlsub[fsupc+1]; j++) {
	    lsub[nextl] = perm_r[lsub[j]]; /* Now indexed into P*A */
	    nextl++;
  	}
	for (k = fsupc+1; k < xsup[i+1]; k++) 
	    	xlsub[k] = nextl;	/* Other columns in supernode i */

    }

    xlsub[n] = nextl;
}